

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::on_inactivity_tick(torrent *this,error_code *ec)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  unique_lock<std::mutex> local_28;
  
  this->field_0x5db = this->field_0x5db & 0xfb;
  if (ec->failed_ == false) {
    bVar2 = is_inactive_internal(this);
    if (((*(uint *)&this->field_0x600 & 0x40) == 0) == bVar2) {
      *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xffffffbf | (uint)bVar2 << 6;
      update_state_list(this);
      bVar2 = want_tick(this);
      update_list(this,(torrent_list_index_t)0x1,bVar2);
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_28._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar3) + 0x438);
      local_28._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_28);
      local_28._M_owns = true;
      uVar1 = *(uint *)(CONCAT44(extraout_var,iVar3) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
      if ((uVar1 >> 0xd & 1) != 0) {
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x2c])();
      }
    }
  }
  return;
}

Assistant:

void torrent::on_inactivity_tick(error_code const& ec) try
	{
		m_pending_active_change = false;

		if (ec) return;

		bool const is_inactive = is_inactive_internal();
		if (is_inactive == m_inactive) return;

		m_inactive = is_inactive;

		update_state_list();
		update_want_tick();

		if (settings().get_bool(settings_pack::dont_count_slow_torrents))
			m_ses.trigger_auto_manage();
	}
	catch (...) { handle_exception(); }